

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O3

void duckdb::IntervalToStringCast::FormatSignedNumber(int64_t value,char *buffer,idx_t *length)

{
  idx_t iVar1;
  int iVar2;
  unsigned_long value_00;
  unsigned_long uVar3;
  char *pcVar4;
  long val;
  
  val = -value;
  if (0 < value) {
    val = value;
  }
  value_00 = NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
  iVar2 = NumericHelper::UnsignedLength<unsigned_long>(value_00);
  uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(iVar2 - (int)(value >> 0x3f));
  iVar1 = *length;
  *length = uVar3 + iVar1;
  pcVar4 = NumericHelper::FormatUnsigned<unsigned_long>(value_00,buffer + uVar3 + iVar1);
  if (value < 0) {
    pcVar4[-1] = '-';
  }
  return;
}

Assistant:

static void FormatSignedNumber(int64_t value, char buffer[], idx_t &length) {
		int sign = -(value < 0);
		auto unsigned_value = NumericCast<uint64_t>((value ^ sign) - sign);
		length += NumericCast<idx_t>(NumericHelper::UnsignedLength<uint64_t>(unsigned_value) - sign);
		auto endptr = buffer + length;
		endptr = NumericHelper::FormatUnsigned<uint64_t>(unsigned_value, endptr);
		if (sign) {
			*--endptr = '-';
		}
	}